

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<spirv_cross::BuiltInResource,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::BuiltInResource,_8UL>::operator=
          (SmallVector<spirv_cross::BuiltInResource,_8UL> *this,
          SmallVector<spirv_cross::BuiltInResource,_8UL> *other)

{
  BuiltInResource *__ptr;
  ulong uVar1;
  size_t sVar2;
  BuiltInResource *pBVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  
  clear(this);
  pBVar3 = (other->super_VectorView<spirv_cross::BuiltInResource>).ptr;
  if (pBVar3 == (BuiltInResource *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size);
    lVar5 = 0;
    for (uVar4 = 0; uVar1 = (other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size,
        uVar4 < uVar1; uVar4 = uVar4 + 1) {
      BuiltInResource::BuiltInResource
                ((BuiltInResource *)
                 ((long)&((this->super_VectorView<spirv_cross::BuiltInResource>).ptr)->builtin +
                 lVar5),(BuiltInResource *)
                        ((long)&((other->super_VectorView<spirv_cross::BuiltInResource>).ptr)->
                                builtin + lVar5));
      ::std::__cxx11::string::~string
                ((string *)
                 ((long)&(((other->super_VectorView<spirv_cross::BuiltInResource>).ptr)->resource).
                         name._M_dataplus._M_p + lVar5));
      lVar5 = lVar5 + 0x38;
    }
    (this->super_VectorView<spirv_cross::BuiltInResource>).buffer_size = uVar1;
    (other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size = 0;
  }
  else {
    __ptr = (this->super_VectorView<spirv_cross::BuiltInResource>).ptr;
    if (__ptr != (BuiltInResource *)&this->stack_storage) {
      free(__ptr);
      pBVar3 = (other->super_VectorView<spirv_cross::BuiltInResource>).ptr;
    }
    (this->super_VectorView<spirv_cross::BuiltInResource>).ptr = pBVar3;
    sVar2 = other->buffer_capacity;
    (this->super_VectorView<spirv_cross::BuiltInResource>).buffer_size =
         (other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size;
    this->buffer_capacity = sVar2;
    (other->super_VectorView<spirv_cross::BuiltInResource>).ptr = (BuiltInResource *)0x0;
    (other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}